

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Node * __thiscall llvm::yaml::KeyValueNode::getValue(KeyValueNode *this)

{
  TokenKind TVar1;
  Document *pDVar2;
  Scanner *this_00;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar3;
  char *pcVar4;
  bool bVar5;
  Node *pNVar6;
  Token *pTVar7;
  Node *this_01;
  Token local_70;
  Twine local_38;
  
  if (this->Value != (Node *)0x0) {
    return this->Value;
  }
  pNVar6 = getKey(this);
  if (pNVar6 == (Node *)0x0) {
    Twine::Twine(&local_38,"Null key in Key Value.");
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                &((((this->super_Node).Doc)->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    Scanner::setError(*(Scanner **)
                       &((((this->super_Node).Doc)->_M_t).
                         super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                         .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream
                        ->scanner,&local_38,(pTVar7->Range).Data);
    this_01 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                                .
                                                super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                               ._M_head_impl)->NodeAllocator,0x10);
    if (this_01 == (Node *)0x0) {
      this_01 = (Node *)0x0;
    }
    else {
      puVar3 = (this->super_Node).Doc;
      ((Node *)&this_01->_vptr_Node)->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      this_01->Doc = puVar3;
      (this_01->SourceRange).Start.Ptr = (char *)0x0;
      (this_01->SourceRange).End.Ptr = (char *)0x0;
      this_01->TypeID = 0;
      (this_01->Anchor).Data = (char *)0x0;
      (this_01->Anchor).Length = 0;
      (this_01->Tag).Data = (char *)0x0;
      (this_01->Tag).Length = 0;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  &((puVar3->_M_t).
                                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                   _M_head_impl)->stream->scanner);
      pcVar4 = (pTVar7->Range).Data;
      (this_01->SourceRange).Start.Ptr = pcVar4;
      (this_01->SourceRange).End.Ptr = pcVar4;
      ((Node *)&this_01->_vptr_Node)->_vptr_Node = (_func_int **)&PTR_anchor_01099790;
    }
    this->Value = this_01;
  }
  else {
    (*pNVar6->_vptr_Node[1])(pNVar6);
    this_01 = (Node *)0x0;
  }
  if (pNVar6 == (Node *)0x0) {
    return this_01;
  }
  pDVar2 = (((this->super_Node).Doc)->_M_t).
           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
  this_00 = *(Scanner **)&pDVar2->stream->scanner;
  if (this_00->Failed == true) {
    pNVar6 = (Node *)Node::operator_new(0x48,&pDVar2->NodeAllocator,0x10);
    if (pNVar6 != (Node *)0x0) {
      puVar3 = (this->super_Node).Doc;
      ((Node *)&pNVar6->_vptr_Node)->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
      pNVar6->Doc = puVar3;
      (pNVar6->SourceRange).Start.Ptr = (char *)0x0;
      (pNVar6->SourceRange).End.Ptr = (char *)0x0;
      pNVar6->TypeID = 0;
      (pNVar6->Anchor).Data = (char *)0x0;
      (pNVar6->Anchor).Length = 0;
      (pNVar6->Tag).Data = (char *)0x0;
      (pNVar6->Tag).Length = 0;
      pTVar7 = Scanner::peekNext(*(Scanner **)
                                  &((puVar3->_M_t).
                                    super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                    .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                   _M_head_impl)->stream->scanner);
      pcVar4 = (pTVar7->Range).Data;
      (pNVar6->SourceRange).Start.Ptr = pcVar4;
      (pNVar6->SourceRange).End.Ptr = pcVar4;
      ((Node *)&pNVar6->_vptr_Node)->_vptr_Node = (_func_int **)&PTR_anchor_01099790;
      goto LAB_00dc22e2;
    }
  }
  else {
    pTVar7 = Scanner::peekNext(this_00);
    TVar1 = pTVar7->Kind;
    if (TVar1 < TK_Scalar) {
      if ((0x18901U >> (TVar1 & (TK_Key|TK_FlowMappingEnd)) & 1) != 0) {
        this_01 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                                                                                        
                                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                                  .
                                                  super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                                  ._M_head_impl)->NodeAllocator,0x10);
        if (this_01 == (Node *)0x0) goto LAB_00dc2271;
        puVar3 = (this->super_Node).Doc;
        ((Node *)&this_01->_vptr_Node)->_vptr_Node = (_func_int **)&PTR_anchor_01099770;
        this_01->Doc = puVar3;
        (this_01->SourceRange).Start.Ptr = (char *)0x0;
        (this_01->SourceRange).End.Ptr = (char *)0x0;
        this_01->TypeID = 0;
        (this_01->Anchor).Data = (char *)0x0;
        (this_01->Anchor).Length = 0;
        (this_01->Tag).Data = (char *)0x0;
        (this_01->Tag).Length = 0;
        pTVar7 = Scanner::peekNext(*(Scanner **)
                                    &((puVar3->_M_t).
                                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>.
                                     _M_head_impl)->stream->scanner);
        pcVar4 = (pTVar7->Range).Data;
        (this_01->SourceRange).Start.Ptr = pcVar4;
        (this_01->SourceRange).End.Ptr = pcVar4;
        ((Node *)&this_01->_vptr_Node)->_vptr_Node = (_func_int **)&PTR_anchor_01099790;
        goto LAB_00dc2274;
      }
      if (TVar1 != TK_Value) goto LAB_00dc2215;
      Scanner::getNext(&local_70,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      bVar5 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.Value._M_dataplus._M_p != &local_70.Value.field_2) {
        operator_delete(local_70.Value._M_dataplus._M_p,
                        local_70.Value.field_2._M_allocated_capacity + 1);
      }
    }
    else {
LAB_00dc2215:
      Twine::Twine(&local_38,"Unexpected token in Key Value.");
      Scanner::setError(*(Scanner **)
                         &((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner,&local_38,(pTVar7->Range).Data);
      this_01 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                                  .
                                                  super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                                 ._M_head_impl)->NodeAllocator,0x10);
      if (this_01 == (Node *)0x0) {
LAB_00dc2271:
        this_01 = (Node *)0x0;
      }
      else {
        NullNode::NullNode((NullNode *)this_01,(this->super_Node).Doc);
      }
LAB_00dc2274:
      this->Value = this_01;
      bVar5 = false;
    }
    if (!bVar5) {
      return this_01;
    }
    pTVar7 = Scanner::peekNext(*(Scanner **)
                                &((((this->super_Node).Doc)->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    if ((pTVar7->Kind != TK_Key) && (pTVar7->Kind != TK_BlockEnd)) {
      pNVar6 = Document::parseBlockNode
                         ((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl);
      goto LAB_00dc22e2;
    }
    pNVar6 = (Node *)Node::operator_new(0x48,&((((this->super_Node).Doc)->_M_t).
                                               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>
                                              ._M_head_impl)->NodeAllocator,0x10);
    if (pNVar6 != (Node *)0x0) {
      NullNode::NullNode((NullNode *)pNVar6,(this->super_Node).Doc);
      goto LAB_00dc22e2;
    }
  }
  pNVar6 = (Node *)0x0;
LAB_00dc22e2:
  this->Value = pNVar6;
  return pNVar6;
}

Assistant:

Node *KeyValueNode::getValue() {
  if (Value)
    return Value;

  if (Node* Key = getKey())
    Key->skip();
  else {
    setError("Null key in Key Value.", peekNext());
    return Value = new (getAllocator()) NullNode(Doc);
  }

  if (failed())
    return Value = new (getAllocator()) NullNode(Doc);

  // Handle implicit null values.
  {
    Token &t = peekNext();
    if (   t.Kind == Token::TK_BlockEnd
        || t.Kind == Token::TK_FlowMappingEnd
        || t.Kind == Token::TK_Key
        || t.Kind == Token::TK_FlowEntry
        || t.Kind == Token::TK_Error) {
      return Value = new (getAllocator()) NullNode(Doc);
    }

    if (t.Kind != Token::TK_Value) {
      setError("Unexpected token in Key Value.", t);
      return Value = new (getAllocator()) NullNode(Doc);
    }
    getNext(); // skip TK_Value.
  }

  // Handle explicit null values.
  Token &t = peekNext();
  if (t.Kind == Token::TK_BlockEnd || t.Kind == Token::TK_Key) {
    return Value = new (getAllocator()) NullNode(Doc);
  }

  // We got a normal value.
  return Value = parseBlockNode();
}